

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  ushort uVar2;
  BuilderArena *pBVar3;
  CapTableBuilder *pCVar4;
  byte bVar5;
  SegmentBuilder *pSVar6;
  WirePointer *pWVar7;
  WirePointer *pWVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  word *result_1;
  word *result;
  Exception *pEVar12;
  int iVar13;
  WirePointer *src_00;
  Exception *pEVar14;
  uint uVar15;
  AllocateResult AVar16;
  WirePointer *dstRef;
  SegmentBuilder *subSegment;
  Fault local_80;
  Exception *local_78;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> local_70;
  WirePointer *local_50;
  uint local_44;
  CapTableBuilder *local_40;
  ulong local_38;
  
  uVar15 = (src->offsetAndKind).value;
  iVar13 = (int)uVar15 >> 2;
  local_40 = capTable;
  switch(uVar15 & 3) {
  case 0:
    uVar10 = (src->field_1).upper32Bits;
    if (uVar10 == 0 && uVar15 == 0) {
      pWVar8 = *dst;
      pWVar8->offsetAndKind = 0;
      pWVar8->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar15 = (uVar10 & 0xffff) + (uVar10 >> 0x10);
    pWVar8 = *dst;
    if ((pWVar8->field_1).upper32Bits != 0 || (pWVar8->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar8);
    }
    if (uVar15 == 0) {
      local_78 = (Exception *)*dst;
      (((WirePointer *)local_78)->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pSVar6 = *segment;
      local_78 = (Exception *)pSVar6->pos;
      if ((long)(ulong)uVar15 <=
          (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)local_78)) >> 3) {
        pSVar6->pos = (word *)((long)local_78 + (ulong)uVar15 * 8);
        if (local_78 != (Exception *)0x0) {
          ((*dst)->offsetAndKind).value =
               ((uint)((ulong)((long)local_78 - (long)*dst) >> 1) & 0xfffffffc) - 4;
          goto LAB_00366f2f;
        }
        pSVar6 = *segment;
      }
      AVar16 = BuilderArena::allocate
                         ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar15 + 1);
      pWVar7 = (WirePointer *)AVar16.words;
      pSVar6 = AVar16.segment;
      *segment = pSVar6;
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar8->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar6->super_SegmentReader).id.value;
      *dst = pWVar7;
      (pWVar7->offsetAndKind).value = 0;
      local_78 = (Exception *)(pWVar7 + 1);
    }
LAB_00366f2f:
    pEVar14 = (Exception *)*segment;
    uVar1 = *(ushort *)&src->field_1;
    uVar15 = (uint)uVar1;
    uVar11 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 == 0) {
      uVar15 = 0;
    }
    else {
      memcpy(local_78,src + (long)iVar13 + 1,(ulong)((uint)uVar1 * 8));
    }
    pCVar4 = local_40;
    if (uVar11 != 0) {
      pWVar8 = (WirePointer *)
               ((long)&src[(long)iVar13 + 1].offsetAndKind.value + (ulong)(uVar15 << 3));
      pEVar12 = (Exception *)((long)local_78->trace + ((ulong)(uVar15 << 3) - 0x68));
      do {
        local_80.exception = pEVar12;
        local_70._0_8_ = pEVar14;
        copyMessage((SegmentBuilder **)&local_70,pCVar4,(WirePointer **)&local_80,pWVar8);
        pEVar12 = (Exception *)&(pEVar12->ownFile).content.size_;
        pWVar8 = pWVar8 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    (*dst)->field_1 = src->field_1;
    return (word *)(WirePointer *)local_78;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              ((Fault *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x404,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal((Fault *)&local_70);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              ((Fault *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x401,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal((Fault *)&local_70);
  }
  uVar15 = (src->field_1).upper32Bits;
  bVar5 = (byte)uVar15 & 7;
  if (5 < bVar5) {
    if ((uVar15 & 7) != 6) {
      uVar10 = uVar15 >> 3;
      if (uVar10 == 0x1fffffff) {
        copyMessage::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_80);
      }
      pWVar8 = *dst;
      if ((pWVar8->field_1).upper32Bits != 0 || (pWVar8->offsetAndKind).value != 0) {
        zeroObject(*segment,capTable,pWVar8);
      }
      local_50 = src + (long)iVar13 + 1;
      pSVar6 = *segment;
      local_78 = (Exception *)pSVar6->pos;
      if ((long)(ulong)(uVar10 + 1) <=
          (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)local_78)) >> 3) {
        pSVar6->pos = (word *)((long)local_78 + (ulong)(uVar10 + 1) * 8);
        if (local_78 != (Exception *)0x0) {
          pWVar8 = *dst;
          (pWVar8->offsetAndKind).value =
               ((uint)((ulong)((long)local_78 - (long)pWVar8) >> 1) & 0xfffffffc) - 3;
          goto LAB_00367106;
        }
        pSVar6 = *segment;
      }
      pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
      if (0xffffffef < uVar15) {
        allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_70);
      }
      AVar16 = BuilderArena::allocate(pBVar3,uVar10 + 2);
      pWVar8 = (WirePointer *)AVar16.words;
      pSVar6 = AVar16.segment;
      *segment = pSVar6;
      pWVar7 = *dst;
      (pWVar7->offsetAndKind).value =
           (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar7->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar6->super_SegmentReader).id.value;
      *dst = pWVar8;
      (pWVar8->offsetAndKind).value = 1;
      local_78 = (Exception *)(pWVar8 + 1);
LAB_00367106:
      pCVar4 = local_40;
      (pWVar8->field_1).upper32Bits = (src->field_1).upper32Bits | 7;
      *(WirePointer *)&(((WirePointer *)local_78)->offsetAndKind).value = *local_50;
      uVar15 = (local_50->offsetAndKind).value;
      local_70.left = uVar15 & 3;
      local_70.result = local_70.left == 0;
      local_70.right = STRUCT;
      local_70.op.content.ptr = " == ";
      local_70.op.content.size_ = 5;
      if (!local_70.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[48]>
                  (&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x3f3,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE of lists is not yet supported.\"",&local_70,
                   (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
        kj::_::Debug::Fault::fatal(&local_80);
      }
      local_44 = uVar15 >> 2 & 0x1fffffff;
      if (local_44 == 0) {
        return (word *)(WirePointer *)local_78;
      }
      pWVar8 = local_50 + 1;
      pWVar7 = (WirePointer *)((long)local_78 + 8);
      uVar1 = *(ushort *)&local_50->field_1;
      uVar2 = (local_50->field_1).structRef.ptrCount.value;
      local_38 = 0;
      do {
        uVar11 = (ulong)uVar2;
        uVar15 = (uint)uVar1;
        pEVar14 = (Exception *)*segment;
        if (uVar1 == 0) {
          uVar15 = 0;
        }
        else {
          memcpy(pWVar7,pWVar8,(ulong)uVar1 << 3);
        }
        if (uVar2 != 0) {
          src_00 = (WirePointer *)((long)&(pWVar8->offsetAndKind).value + (ulong)(uVar15 << 3));
          pEVar12 = (Exception *)((long)&(pWVar7->offsetAndKind).value + (ulong)(uVar15 << 3));
          do {
            local_80.exception = pEVar12;
            local_70._0_8_ = pEVar14;
            copyMessage((SegmentBuilder **)&local_70,pCVar4,(WirePointer **)&local_80,src_00);
            pEVar12 = (Exception *)&(pEVar12->ownFile).content.size_;
            src_00 = src_00 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar1 = *(ushort *)&local_50->field_1;
        uVar2 = *(ushort *)((long)&local_50->field_1 + 2);
        uVar11 = (ulong)(((uint)uVar2 + (uint)uVar1) * 8);
        pWVar8 = (WirePointer *)((long)&(pWVar8->offsetAndKind).value + uVar11);
        pWVar7 = (WirePointer *)((long)&(pWVar7->offsetAndKind).value + uVar11);
        uVar15 = (int)local_38 + 1;
        local_38 = (ulong)uVar15;
      } while (uVar15 != local_44);
      return (word *)(WirePointer *)local_78;
    }
    uVar15 = uVar15 >> 3;
    pWVar8 = *dst;
    if ((pWVar8->field_1).upper32Bits != 0 || (pWVar8->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar8);
    }
    pSVar6 = *segment;
    local_78 = (Exception *)pSVar6->pos;
    if ((long)(ulong)uVar15 <=
        (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
              ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)local_78)) >> 3) {
      pSVar6->pos = (word *)(local_78->trace + ((ulong)uVar15 - 0xd));
      if (local_78 != (Exception *)0x0) {
        pWVar7 = *dst;
        (pWVar7->offsetAndKind).value =
             ((uint)((ulong)((long)local_78 - (long)pWVar7) >> 1) & 0xfffffffc) - 3;
        goto LAB_0036702e;
      }
      pSVar6 = *segment;
    }
    pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
    if (uVar15 == 0x1fffffff) {
      allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_70);
    }
    AVar16 = BuilderArena::allocate(pBVar3,uVar15 + 1);
    pWVar7 = (WirePointer *)AVar16.words;
    pSVar6 = AVar16.segment;
    *segment = pSVar6;
    pWVar8 = *dst;
    (pWVar8->offsetAndKind).value =
         (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
    pWVar8->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar6->super_SegmentReader).id.value;
    *dst = pWVar7;
    (pWVar7->offsetAndKind).value = 1;
    local_78 = (Exception *)(pWVar7 + 1);
LAB_0036702e:
    uVar15 = (src->field_1).upper32Bits;
    if (7 < uVar15) {
      pWVar8 = src + iVar13;
      uVar11 = (ulong)(uVar15 >> 3);
      pEVar14 = local_78;
      do {
        pWVar8 = pWVar8 + 1;
        local_70._0_8_ = *segment;
        local_80.exception = pEVar14;
        copyMessage((SegmentBuilder **)&local_70,capTable,(WirePointer **)&local_80,pWVar8);
        pEVar14 = (Exception *)&(pEVar14->ownFile).content.size_;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      pWVar7 = *dst;
      uVar15 = (src->field_1).upper32Bits;
    }
    (pWVar7->field_1).upper32Bits = uVar15 & 0xfffffff8 | 6;
    return (word *)local_78;
  }
  uVar11 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar5 * 4) * (ulong)(uVar15 >> 3) + 0x3f
           >> 6;
  pWVar8 = *dst;
  if ((pWVar8->field_1).upper32Bits != 0 || (pWVar8->offsetAndKind).value != 0) {
    zeroObject(*segment,capTable,pWVar8);
  }
  pSVar6 = *segment;
  pWVar8 = (WirePointer *)pSVar6->pos;
  iVar9 = (int)uVar11;
  uVar11 = uVar11 & 0xffffffff;
  if ((long)uVar11 <=
      (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
            ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pWVar8)) >> 3) {
    pSVar6->pos = (word *)(pWVar8 + uVar11);
    if (pWVar8 != (WirePointer *)0x0) {
      pWVar7 = *dst;
      (pWVar7->offsetAndKind).value =
           ((uint)((ulong)((long)pWVar8 - (long)pWVar7) >> 1) & 0xfffffffc) - 3;
      goto LAB_00366e12;
    }
    pSVar6 = *segment;
  }
  pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
  if (0x1fffffff < iVar9 + 1U) {
    allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_70);
  }
  AVar16 = BuilderArena::allocate(pBVar3,iVar9 + 1U);
  pWVar7 = (WirePointer *)AVar16.words;
  pSVar6 = AVar16.segment;
  *segment = pSVar6;
  pWVar8 = *dst;
  (pWVar8->offsetAndKind).value =
       (int)AVar16.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
  pWVar8->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar6->super_SegmentReader).id.value;
  *dst = pWVar7;
  (pWVar7->offsetAndKind).value = 1;
  pWVar8 = pWVar7 + 1;
LAB_00366e12:
  if (iVar9 != 0) {
    memcpy(pWVar8,src + (long)iVar13 + 1,(ulong)(uint)(iVar9 << 3));
    pWVar7 = *dst;
  }
  pWVar7->field_1 = src->field_1;
  return (word *)pWVar8;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }